

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Builder * capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                    (Builder *__return_storage_ptr__,PointerBuilder builder,StructSchema schema)

{
  StructSchema SVar1;
  uint uVar2;
  uint uVar3;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_57;
  StructSchema schema_local;
  Fault f;
  void *local_38;
  uint local_28;
  
  schema_local = schema;
  Schema::getProto((Reader *)&f,&schema_local.super_Schema);
  SVar1 = schema_local;
  if (0xe0 < local_28) {
    __kjCondition =
         (RawBrandedSchema *)
         (CONCAT71(uStack_57,*(byte *)((long)local_38 + 0x1c)) & 0xffffffffffffff01 ^ 1);
    if ((*(byte *)((long)local_38 + 0x1c) & 1) != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x776,FAILED,"!schema.getProto().getStruct().getIsGroup()",
                 "_kjCondition,\"Cannot form pointer to group type.\"",&_kjCondition,
                 (char (*) [35])"Cannot form pointer to group type.");
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  __kjCondition = schema_local.super_Schema.raw;
  Schema::getProto((Reader *)&f,(Schema *)&_kjCondition);
  uVar3 = 0;
  uVar2 = 0;
  if (0x7f < local_28) {
    uVar2 = (uint)*(ushort *)((long)local_38 + 0xe);
  }
  if (0xcf < local_28) {
    uVar3 = (uint)*(ushort *)((long)local_38 + 0x18) << 0x10;
  }
  PointerBuilder::getStruct
            (&__return_storage_ptr__->builder,&builder,(StructSize)(uVar3 | uVar2),(word *)0x0);
  (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)SVar1.super_Schema.raw;
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::getDynamic(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema, builder.getStruct(
      structSizeFromSchema(schema), nullptr));
}